

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Vector3D * __thiscall
CMU462::Matrix3x3::operator*(Vector3D *__return_storage_ptr__,Matrix3x3 *this,Vector3D *x)

{
  double *pdVar1;
  int local_94;
  Vector3D local_90;
  int local_74;
  Vector3D local_70;
  int local_54;
  Vector3D local_50;
  Vector3D local_38;
  Vector3D *local_20;
  Vector3D *x_local;
  Matrix3x3 *this_local;
  
  local_54 = 0;
  local_20 = x;
  x_local = this->entries;
  this_local = (Matrix3x3 *)__return_storage_ptr__;
  pdVar1 = Vector3D::operator[](x,&local_54);
  CMU462::operator*(&local_50,pdVar1,this->entries);
  local_74 = 1;
  pdVar1 = Vector3D::operator[](local_20,&local_74);
  CMU462::operator*(&local_70,pdVar1,this->entries + 1);
  Vector3D::operator+(&local_38,&local_50,&local_70);
  local_94 = 2;
  pdVar1 = Vector3D::operator[](local_20,&local_94);
  CMU462::operator*(&local_90,pdVar1,this->entries + 2);
  Vector3D::operator+(__return_storage_ptr__,&local_38,&local_90);
  return __return_storage_ptr__;
}

Assistant:

Vector3D Matrix3x3::operator*( const Vector3D& x ) const {
    return x[0]*entries[0] +
           x[1]*entries[1] +
           x[2]*entries[2] ;
  }